

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
kj::Maybe<kj::HttpServer::SuspendedRequest>::Maybe
          (Maybe<kj::HttpServer::SuspendedRequest> *this,
          Maybe<kj::HttpServer::SuspendedRequest> *other)

{
  anon_union_168_1_a8c68091_for_NullableValue<kj::HttpServer::SuspendedRequest>_2 *paVar1;
  uint uVar2;
  uchar *puVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  byte bVar6;
  
  bVar6 = (other->ptr).isSet;
  (this->ptr).isSet = (bool)bVar6;
  if ((bool)bVar6 == true) {
    (this->ptr).field_1.value.buffer.ptr = (other->ptr).field_1.value.buffer.ptr;
    (this->ptr).field_1.value.buffer.size_ = (other->ptr).field_1.value.buffer.size_;
    (this->ptr).field_1.value.buffer.disposer = (other->ptr).field_1.value.buffer.disposer;
    (other->ptr).field_1.value.buffer.ptr = (uchar *)0x0;
    (other->ptr).field_1.value.buffer.size_ = 0;
    sVar4 = (other->ptr).field_1.value.leftover.size_;
    (this->ptr).field_1.value.leftover.ptr = (other->ptr).field_1.value.leftover.ptr;
    (this->ptr).field_1.value.leftover.size_ = sVar4;
    uVar2 = (other->ptr).field_1.value.method.tag;
    (this->ptr).field_1.value.method.tag = uVar2;
    if (uVar2 == 1) {
      *(undefined4 *)&(this->ptr).field_1.value.method.field_1 =
           *(undefined4 *)&(other->ptr).field_1.value.method.field_1;
    }
    sVar4 = (other->ptr).field_1.value.url.content.size_;
    (this->ptr).field_1.value.url.content.ptr = (other->ptr).field_1.value.url.content.ptr;
    (this->ptr).field_1.value.url.content.size_ = sVar4;
    HttpHeaders::HttpHeaders(&(this->ptr).field_1.value.headers,&(other->ptr).field_1.value.headers)
    ;
    bVar6 = (other->ptr).isSet;
  }
  if ((bVar6 & 1) != 0) {
    (other->ptr).isSet = false;
    paVar1 = &(other->ptr).field_1;
    HttpHeaders::~HttpHeaders(&(other->ptr).field_1.value.headers);
    if ((other->ptr).field_1.value.method.tag - 1 < 2) {
      (other->ptr).field_1.value.method.tag = 0;
    }
    puVar3 = (paVar1->value).buffer.ptr;
    if (puVar3 != (uchar *)0x0) {
      sVar4 = (other->ptr).field_1.value.buffer.size_;
      (paVar1->value).buffer.ptr = (uchar *)0x0;
      (other->ptr).field_1.value.buffer.size_ = 0;
      pAVar5 = (other->ptr).field_1.value.buffer.disposer;
      (**pAVar5->_vptr_ArrayDisposer)(pAVar5,puVar3,1,sVar4,sVar4,0);
    }
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }